

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gsl.hpp
# Opt level: O2

span<pstore::index::details::index_pointer,__1L> __thiscall
pstore::gsl::span<pstore::index::details::index_pointer,_-1L>::last
          (span<pstore::index::details::index_pointer,__1L> *this,index_type count)

{
  long lVar1;
  pointer peVar2;
  span<pstore::index::details::index_pointer,__1L> sVar3;
  extent_type<_1L> local_20 [2];
  
  if ((-1 < count) && (lVar1 = (this->storage_).super_extent_type<_1L>.size_, count <= lVar1)) {
    peVar2 = (this->storage_).data_;
    details::extent_type<-1L>::extent_type(local_20,count);
    sVar3.storage_.data_ = peVar2 + (lVar1 - count);
    sVar3.storage_.super_extent_type<_1L>.size_ = local_20[0].size_;
    return (span<pstore::index::details::index_pointer,__1L>)sVar3.storage_;
  }
  assert_failed("count >= 0 && count <= size ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/gsl.hpp"
                ,0x16a);
}

Assistant:

span<element_type, dynamic_extent> last (index_type count) const {
                PSTORE_ASSERT (count >= 0 && count <= size ());
                return {data () + (size () - count), count};
            }